

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O0

void helicsEndpointSendString(HelicsEndpoint endpoint,char *message,HelicsError *err)

{
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  long in_RSI;
  int in_R8D;
  EndpointObject *endObj;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  data_view *in_stack_ffffffffffffff70;
  Endpoint *pEVar1;
  int __fd;
  HelicsEndpoint in_stack_ffffffffffffff78;
  undefined1 local_70 [48];
  undefined1 local_40 [32];
  EndpointObject *local_20;
  long local_10;
  
  local_10 = in_RSI;
  local_20 = anon_unknown.dwarf_784a3::verifyEndpoint
                       (in_stack_ffffffffffffff78,(HelicsError *)in_stack_ffffffffffffff70);
  if (local_20 != (EndpointObject *)0x0) {
    if (local_10 == 0) {
      pEVar1 = local_20->endPtr;
      helics::data_view::data_view<std::__cxx11::string_const&,void>
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      helics::Endpoint::send(pEVar1,(int)local_40,__buf,in_RCX,in_R8D);
      helics::data_view::~data_view((data_view *)0x1de2df);
    }
    else {
      pEVar1 = local_20->endPtr;
      __fd = (int)local_70;
      helics::data_view::data_view<char_const*&,void>
                ((data_view *)pEVar1,(char **)in_stack_ffffffffffffff68);
      helics::Endpoint::send(pEVar1,__fd,__buf_00,in_RCX,in_R8D);
      helics::data_view::~data_view((data_view *)0x1de33d);
    }
  }
  return;
}

Assistant:

void helicsEndpointSendString(HelicsEndpoint endpoint, const char* message, HelicsError* err)
{
    auto* endObj = verifyEndpoint(endpoint, err);
    if (endObj == nullptr) {
        return;
    }
    try {
        if (message == nullptr) {
            endObj->endPtr->send(gHelicsEmptyStr);
        } else {
            endObj->endPtr->send(message);
        }
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}